

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QString * simpleTypeString(QString *__return_storage_ptr__,Type t)

{
  int *piVar1;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QMessageLogger local_40;
  QString *local_20;
  
  local_20 = *(QString **)(in_FS_OFFSET + 0x28);
  if ((uint)(t + 0xffffff00) < 0x100) {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"simple(%1)";
    QString::fromLatin1((QString *)&local_40,(QString *)0xa,ba);
    QString::arg_impl(__return_storage_ptr__,(QString *)&local_40,(ulong)(uint)(t + 0xffffff00),0,10
                      ,(QChar)0x20);
    piVar1 = (int *)CONCAT44(local_40.context.line,local_40.context.version);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_40.context.line,local_40.context.version),2,0x10);
      }
    }
  }
  else {
    local_40.context.version = 2;
    local_40.context.line = 0;
    local_40.context.file._0_4_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.function._4_4_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning(&local_40,"QCborValue: found unknown type 0x%x");
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_20) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString simpleTypeString(QCborValue::Type t)
{
    int simpleType = t - QCborValue::SimpleType;
    if (unsigned(simpleType) < 0x100)
        return QString::fromLatin1("simple(%1)").arg(simpleType);

    // if we got here, we got an unknown type
    qWarning("QCborValue: found unknown type 0x%x", t);
    return QString();

}